

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O1

void __thiscall
slang::ast::builtins::StringSubstrMethod::~StringSubstrMethod(StringSubstrMethod *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer p;
  pointer p_00;
  
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_00cd1330;
  p = (this->super_SimpleSystemSubroutine).argTypes.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start;
  if (p != (pointer)0x0) {
    operator_delete(p,(long)(this->super_SimpleSystemSubroutine).argTypes.
                            super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)p);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00cd12c8;
  p_00 = (this->super_SimpleSystemSubroutine).super_SystemSubroutine.name._M_dataplus._M_p;
  paVar1 = &(this->super_SimpleSystemSubroutine).super_SystemSubroutine.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p_00 != paVar1) {
    operator_delete(p_00,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit StringSubstrMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Substr, SubroutineKind::Function, 2,
                               {&builtins.intType, &builtins.intType}, builtins.stringType, true) {}